

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O3

void __thiscall
SGParser::BacktrackingTokenStream<SGParser::GenericToken>::BacktrackingTokenStream
          (BacktrackingTokenStream<SGParser::GenericToken> *this)

{
  _Rb_tree_header *p_Var1;
  StreamBlock *pSVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  
  (this->super_TokenStream<SGParser::GenericToken>)._vptr_TokenStream =
       (_func_int **)&PTR__BacktrackingTokenStream_00161310;
  this->pSourceStream = (TokenStream<SGParser::GenericToken> *)0x0;
  pSVar2 = (StreamBlock *)operator_new(0x7018);
  paVar3 = &pSVar2->Tokens[0].Str.field_2;
  lVar4 = 0x7000;
  do {
    *(undefined4 *)((long)paVar3 + -0x18) = 1;
    (((String *)(paVar3 + -1))->_M_dataplus)._M_p = (pointer)paVar3;
    *(size_type *)((long)paVar3 + -8) = 0;
    paVar3->_M_local_buf[0] = '\0';
    paVar3[1]._M_allocated_capacity = 0;
    *(undefined8 *)((long)paVar3 + 0x18) = 0;
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar3 + 0x38);
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != 0);
  pSVar2->Index = 0;
  pSVar2->Count = 0;
  pSVar2->pNext = (StreamBlock *)0x0;
  this->pFirstBlock = pSVar2;
  this->pThisBlock = pSVar2;
  this->ThisPos = 0;
  this->RememberLength = 1;
  p_Var1 = &(this->Markers)._M_t._M_impl.super__Rb_tree_header;
  (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->LengthLeft = 0;
  this->Pos = 0;
  this->SourceEOFFlag = false;
  (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

BacktrackingTokenStream<Token>::BacktrackingTokenStream()
    : pSourceStream{nullptr},
      pFirstBlock{new StreamBlock}, // Allocate 1 stream block
      pThisBlock{pFirstBlock},
      ThisPos{0u},
      RememberLength{1u},
      LengthLeft{0u},
      Pos{0u},
      SourceEOFFlag{false} {
}